

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O2

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,char **tokenNames_,int numTokens_,RefToken *token_,
          int lower,int upper_,bool matchNot,string *fileName_)

{
  TokenRef *pTVar1;
  int line_;
  int column_;
  allocator<char> local_59;
  int local_58;
  int local_54;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Mismatched Token",&local_59);
  local_58 = lower;
  local_54 = upper_;
  line_ = (*token_->ref->ptr->_vptr_Token[3])();
  column_ = (*token_->ref->ptr->_vptr_Token[2])();
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_50,fileName_,line_,column_);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedTokenException_002c1ea8;
  pTVar1 = token_->ref;
  if (pTVar1 != (TokenRef *)0x0) {
    pTVar1->count = pTVar1->count + 1;
  }
  (this->token).ref = pTVar1;
  ASTRefCount<antlr::AST>::ASTRefCount(&this->node,(AST *)0x0);
  (*token_->ref->ptr->_vptr_Token[4])(&this->tokenText);
  this->mismatchType = matchNot + 3;
  this->expecting = local_58;
  this->upper = local_54;
  BitSet::BitSet(&this->set,0x40);
  this->tokenNames = tokenNames_;
  this->numTokens = numTokens_;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const char* const* tokenNames_,
	const int numTokens_,
	RefToken token_,
	int lower,
	int upper_,
	bool matchNot,
	const ANTLR_USE_NAMESPACE(std)string& fileName_
) : RecognitionException("Mismatched Token",fileName_,token_->getLine(),token_->getColumn())
  , token(token_)
  , node(nullASTptr)
  , tokenText(token_->getText())
  , mismatchType(matchNot ? NOT_RANGE : RANGE)
  , expecting(lower)
  , upper(upper_)
  , tokenNames(tokenNames_)
  , numTokens(numTokens_)
{
}